

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

int mbedtls_blowfish_crypt_ecb(mbedtls_blowfish_context *ctx,int mode,uchar *input,uchar *output)

{
  uint local_30;
  uint local_2c;
  uint32_t X1;
  uint32_t X0;
  uchar *output_local;
  uchar *input_local;
  mbedtls_blowfish_context *pmStack_10;
  int mode_local;
  mbedtls_blowfish_context *ctx_local;
  
  local_2c = (uint)*input << 0x18 | (uint)input[1] << 0x10 | (uint)input[2] << 8 | (uint)input[3];
  local_30 = (uint)input[4] << 0x18 | (uint)input[5] << 0x10 | (uint)input[6] << 8 | (uint)input[7];
  _X1 = output;
  output_local = input;
  input_local._4_4_ = mode;
  pmStack_10 = ctx;
  if (mode == 0) {
    blowfish_dec(ctx,&local_2c,&local_30);
  }
  else {
    blowfish_enc(ctx,&local_2c,&local_30);
  }
  *_X1 = (uchar)(local_2c >> 0x18);
  _X1[1] = (uchar)(local_2c >> 0x10);
  _X1[2] = (uchar)(local_2c >> 8);
  _X1[3] = (uchar)local_2c;
  _X1[4] = (uchar)(local_30 >> 0x18);
  _X1[5] = (uchar)(local_30 >> 0x10);
  _X1[6] = (uchar)(local_30 >> 8);
  _X1[7] = (uchar)local_30;
  return 0;
}

Assistant:

int mbedtls_blowfish_crypt_ecb( mbedtls_blowfish_context *ctx,
                    int mode,
                    const unsigned char input[MBEDTLS_BLOWFISH_BLOCKSIZE],
                    unsigned char output[MBEDTLS_BLOWFISH_BLOCKSIZE] )
{
    uint32_t X0, X1;

    GET_UINT32_BE( X0, input,  0 );
    GET_UINT32_BE( X1, input,  4 );

    if( mode == MBEDTLS_BLOWFISH_DECRYPT )
    {
        blowfish_dec( ctx, &X0, &X1 );
    }
    else /* MBEDTLS_BLOWFISH_ENCRYPT */
    {
        blowfish_enc( ctx, &X0, &X1 );
    }

    PUT_UINT32_BE( X0, output,  0 );
    PUT_UINT32_BE( X1, output,  4 );

    return( 0 );
}